

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O3

int AF_AWeapon_CheckAmmo
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  VMValue *pVVar2;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  char *pcVar6;
  AWeapon *this;
  bool bVar7;
  PClass *pPVar5;
  
  pPVar3 = AWeapon::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar6 = "(paramnum) < numparam";
    goto LAB_004aec9d;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_004aec8d:
    pcVar6 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_004aec9d:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                  ,0x2ae,
                  "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  this = (AWeapon *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this == (AWeapon *)0x0) goto LAB_004aebb1;
    pPVar5 = (this->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject
             .Class;
    if (pPVar5 == (PClass *)0x0) {
      iVar4 = (**(this->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                 super_DObject._vptr_DObject)(this);
      pPVar5 = (PClass *)CONCAT44(extraout_var,iVar4);
      (this->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.Class
           = pPVar5;
    }
    bVar7 = pPVar5 != (PClass *)0x0;
    if (pPVar5 != pPVar3 && bVar7) {
      do {
        pPVar5 = pPVar5->ParentClass;
        bVar7 = pPVar5 != (PClass *)0x0;
        if (pPVar5 == pPVar3) break;
      } while (pPVar5 != (PClass *)0x0);
    }
    if (!bVar7) {
      pcVar6 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AWeapon))";
      goto LAB_004aec9d;
    }
  }
  else {
    if (this != (AWeapon *)0x0) goto LAB_004aec8d;
LAB_004aebb1:
    this = (AWeapon *)0x0;
  }
  if (numparam == 1) {
    pcVar6 = "(paramnum) < numparam";
LAB_004aecc5:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                  ,0x2af,
                  "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[1].field_0.field_3.Type != '\0') {
    pcVar6 = "param[paramnum].Type == REGT_INT";
    goto LAB_004aecc5;
  }
  if (numparam < 3) {
    pcVar6 = "(paramnum) < numparam";
LAB_004aeced:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                  ,0x2b0,
                  "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  if (param[2].field_0.field_3.Type != '\0') {
    pcVar6 = "param[paramnum].Type == REGT_INT";
    goto LAB_004aeced;
  }
  pVVar1 = param + 1;
  pVVar2 = param + 2;
  if (numparam == 3) {
    param = defaultparam->Array;
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_004aed72:
      __assert_fail(pcVar6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                    ,0x2b1,
                    "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    bVar7 = param[3].field_0.i != 0;
  }
  else {
    if (param[3].field_0.field_3.Type != '\0') {
      pcVar6 = "(param[paramnum]).Type == REGT_INT";
      goto LAB_004aed72;
    }
    bVar7 = param[3].field_0.i != 0;
    if (4 < (uint)numparam) {
      if (param[4].field_0.field_3.Type != '\0') {
        pcVar6 = "(param[paramnum]).Type == REGT_INT";
        goto LAB_004aed0c;
      }
      goto LAB_004aec40;
    }
    param = defaultparam->Array;
  }
  if (param[4].field_0.field_3.Type != '\0') {
    pcVar6 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_004aed0c:
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                  ,0x2b2,
                  "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
LAB_004aec40:
  bVar7 = AWeapon::CheckAmmo(this,(pVVar1->field_0).i,(pVVar2->field_0).i != 0,bVar7,
                             param[4].field_0.i);
  if (numret < 1) {
    iVar4 = 0;
  }
  else {
    if (ret == (VMReturn *)0x0) {
      __assert_fail("ret != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                    ,0x2b3,
                    "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    if (ret->RegType != '\0') {
      __assert_fail("RegType == REGT_INT",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                    ,0x13f,"void VMReturn::SetInt(int)");
    }
    *(uint *)ret->Location = (uint)bVar7;
    iVar4 = 1;
  }
  return iVar4;
}

Assistant:

DEFINE_ACTION_FUNCTION(AWeapon, CheckAmmo)
{
	PARAM_SELF_PROLOGUE(AWeapon);
	PARAM_INT(mode);
	PARAM_BOOL(autoswitch);
	PARAM_BOOL_DEF(require);
	PARAM_INT_DEF(ammocnt);
	ACTION_RETURN_BOOL(self->CheckAmmo(mode, autoswitch, require, ammocnt));
}